

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngset.c
# Opt level: O3

void png_set_sCAL(png_const_structrp png_ptr,png_inforp info_ptr,int unit,double width,double height
                 )

{
  char *warning_message;
  char sheight [18];
  char swidth [18];
  char local_68 [32];
  char local_48 [32];
  
  if (width <= 0.0) {
    warning_message = "Invalid sCAL width ignored";
  }
  else {
    if (0.0 < height) {
      png_ascii_from_fp(png_ptr,local_48,0x12,width,5);
      png_ascii_from_fp(png_ptr,local_68,0x12,height,5);
      png_set_sCAL_s(png_ptr,info_ptr,unit,local_48,local_68);
      return;
    }
    warning_message = "Invalid sCAL height ignored";
  }
  png_warning(png_ptr,warning_message);
  return;
}

Assistant:

void PNGAPI
png_set_sCAL(png_const_structrp png_ptr, png_inforp info_ptr, int unit,
    double width, double height)
{
   png_debug1(1, "in %s storage function", "sCAL");

   /* Check the arguments. */
   if (width <= 0)
      png_warning(png_ptr, "Invalid sCAL width ignored");

   else if (height <= 0)
      png_warning(png_ptr, "Invalid sCAL height ignored");

   else
   {
      /* Convert 'width' and 'height' to ASCII. */
      char swidth[PNG_sCAL_MAX_DIGITS+1];
      char sheight[PNG_sCAL_MAX_DIGITS+1];

      png_ascii_from_fp(png_ptr, swidth, (sizeof swidth), width,
          PNG_sCAL_PRECISION);
      png_ascii_from_fp(png_ptr, sheight, (sizeof sheight), height,
          PNG_sCAL_PRECISION);

      png_set_sCAL_s(png_ptr, info_ptr, unit, swidth, sheight);
   }
}